

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

uint64_t kfold_int64arith(jit_State *J,uint64_t k1,uint64_t k2,IROp op)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = (uint)J;
  bVar1 = (byte)k1;
  switch((int)k2) {
  case 0x21:
    return (ulong)J & k1;
  case 0x22:
    return (ulong)J | k1;
  case 0x23:
    return (ulong)J ^ k1;
  case 0x24:
    return (long)J << (bVar1 & 0x3f);
  case 0x25:
    uVar2 = uVar2 >> (bVar1 & 0x1f);
    goto LAB_00154783;
  case 0x26:
    return (ulong)J >> (bVar1 & 0x3f);
  case 0x27:
    bVar3 = (byte)(k1 * 0x1f00000000 >> 0x20);
    break;
  case 0x28:
    bVar3 = bVar1;
    bVar1 = (byte)(k1 * 0x1f00000000 >> 0x20);
    break;
  case 0x29:
    return (long)&(J->cur).nextgc.gcptr64 + k1;
  case 0x2a:
    return (long)J - k1;
  case 0x2b:
    return (long)J * k1;
  default:
    goto switchD_00154729_default;
  }
  uVar2 = uVar2 >> (bVar3 & 0x1f) | uVar2 << (bVar1 & 0x1f);
LAB_00154783:
  J = (jit_State *)(long)(int)uVar2;
switchD_00154729_default:
  return (uint64_t)J;
}

Assistant:

static uint64_t kfold_int64arith(jit_State *J, uint64_t k1, uint64_t k2,
				 IROp op)
{
  UNUSED(J);
#if LJ_HASFFI
  switch (op) {
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
  case IR_BSHL: k1 <<= (k2 & 63); break;
  case IR_BSHR: k1 = (int32_t)((uint32_t)k1 >> (k2 & 63)); break;
  case IR_BSAR: k1 >>= (k2 & 63); break;
  case IR_BROL: k1 = (int32_t)lj_rol((uint32_t)k1, (k2 & 63)); break;
  case IR_BROR: k1 = (int32_t)lj_ror((uint32_t)k1, (k2 & 63)); break;
  default: lj_assertJ(0, "bad IR op %d", op); break;
  }
#else
  UNUSED(k2); UNUSED(op);
  lj_assertJ(0, "FFI IR op without FFI");
#endif
  return k1;
}